

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<no_ansi_port_decl::MainVisitor,_true,_false,_false,_false>::
visit<slang::ast::ProceduralDeassignStatement>
          (ASTVisitor<no_ansi_port_decl::MainVisitor,_true,_false,_false,_false> *this,
          ProceduralDeassignStatement *t)

{
  bool bVar1;
  ProceduralDeassignStatement *in_RSI;
  ASTVisitor<no_ansi_port_decl::MainVisitor,_true,_false,_false,_false> *in_RDI;
  
  bVar1 = Statement::bad(&in_RSI->super_Statement);
  if (!bVar1) {
    visitDefault<slang::ast::ProceduralDeassignStatement>(in_RDI,in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }